

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O3

int read_history(char *filename)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char buf [256];
  undefined8 uStack_120;
  char local_118 [264];
  
  if (H_2 == (void *)0x0) {
    uStack_120 = 0x139d8b;
    H_2 = calloc((long)el_hist_size,8);
  }
  uStack_120 = 0x139da1;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    H_0 = 0;
    if (0 < el_hist_size) {
      do {
        uStack_120 = 0x139dcf;
        pcVar2 = fgets(local_118,0x100,__stream);
        if (pcVar2 == (char *)0x0) break;
        uStack_120 = 0x139ddc;
        sVar3 = strlen(local_118);
        local_118[sVar3 - 1] = '\0';
        if (local_118[0] != '\0') {
          uStack_120 = 0x139df0;
          hist_add(local_118);
        }
      } while (H_0 < el_hist_size);
    }
    uStack_120 = 0x139e06;
    iVar1 = fclose(__stream);
  }
  return iVar1;
}

Assistant:

int read_history(const char *filename)
{
    FILE *fp;
    char buf[SCREEN_INC];

    hist_alloc();

    fp = fopen(filename, "r");
    if (!fp)
	return EOF;

    H.Size = 0;
    while (H.Size < el_hist_size) {
	if (!fgets(buf, SCREEN_INC, fp))
	    break;

	buf[strlen(buf) - 1] = 0; /* Remove '\n' */
	add_history(buf);
    }

    return fclose(fp);
}